

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go.h
# Opt level: O2

void __thiscall GoState<3U,_4U>::dump_board(GoState<3U,_4U> *this,char *file_name)

{
  ostream *poVar1;
  uchar (*pauVar2) [4];
  int i;
  long lVar3;
  int j;
  long lVar4;
  ofstream fout;
  
  std::ofstream::ofstream((ostream *)&fout,file_name,_S_out);
  poVar1 = std::operator<<((ostream *)&fout,"static const int M = ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,";");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&fout,"static const int N = ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,";");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&fout,"char board[M][N+1] = {");
  std::endl<char,std::char_traits<char>>(poVar1);
  pauVar2 = this->board;
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    std::operator<<((ostream *)&fout,"\t\"");
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      if ((*pauVar2)[lVar4] == 0) {
        std::operator<<((ostream *)&fout,".");
      }
      else {
        std::ostream::operator<<((ostream *)&fout,(uint)(*pauVar2)[lVar4]);
      }
    }
    poVar1 = std::operator<<((ostream *)&fout,"\",");
    std::endl<char,std::char_traits<char>>(poVar1);
    pauVar2 = pauVar2 + 1;
  }
  poVar1 = std::operator<<((ostream *)&fout,"};");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::ofstream::~ofstream(&fout);
  return;
}

Assistant:

virtual void dump_board(const char* file_name) const
	{
		std::ofstream fout(file_name);
		fout << "static const int M = " << M << ";" << std::endl;
		fout << "static const int N = " << N << ";" << std::endl;
		fout << "char board[M][N+1] = {" << std::endl;
		for (int i = 0; i < M; ++i) {
			fout << "\t\"";
			for (int j = 0; j < N; ++j) {
				if (board[i][j] == empty) fout << ".";
				else fout << int(board[i][j]);
			}
			fout << "\"," << std::endl;
		}
		fout << "};" << std::endl;
	}